

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O1

bool __thiscall ON_Surface::IsSphere(ON_Surface *this,ON_Sphere *sphere,double tolerance)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  ON_3dPoint point;
  ON_3dPoint point_00;
  ON_3dPoint point_01;
  ON_3dPoint point_02;
  ON_3dPoint point_03;
  ON_3dPoint point_04;
  ON_Surface *pOVar6;
  bool bVar7;
  char cVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *memblock;
  long lVar15;
  ulong uVar16;
  undefined7 uVar17;
  ulong uVar18;
  ON_Plane *pOVar19;
  ON_Circle *pOVar20;
  ON_Sphere *pOVar21;
  bool bVar22;
  byte bVar23;
  ulong uVar24;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined1 auVar29 [16];
  ON_3dPoint P;
  ON_3dPoint S;
  ON_Sphere sph1;
  ON_Sphere sph0;
  ON_Arc arc1;
  ON_Arc arc0;
  uint local_358;
  double local_348;
  double local_340;
  ON_3dPoint local_330;
  ON_3dPoint local_318;
  uint local_300;
  uint local_2fc;
  ON_3dPoint local_2f8;
  undefined1 local_2d8 [16];
  void *local_2c0;
  double local_2b8;
  double local_2b0;
  ulong local_2a8;
  ON_Surface *local_2a0;
  ulong local_298;
  ON_Sphere *local_290;
  ulong local_288;
  ulong local_280;
  ulong local_278;
  ON_Sphere local_270;
  ON_Sphere local_1e8;
  ON_Circle local_160;
  double local_d8;
  double dStack_d0;
  ON_Circle local_c8;
  double local_40;
  double dStack_38;
  long *plVar14;
  
  bVar23 = 0;
  local_2d8._8_4_ = in_XMM0_Dc;
  local_2d8._0_8_ = tolerance;
  local_2d8._12_4_ = in_XMM0_Dd;
  bVar7 = ON_IsValid(tolerance);
  uVar25 = local_2d8._0_4_;
  uVar26 = local_2d8._4_4_;
  uVar27 = local_2d8._8_4_;
  uVar28 = local_2d8._12_4_;
  if (!bVar7) {
    uVar25 = 0;
    uVar26 = 0x3df00000;
    uVar27 = 0;
    uVar28 = 0;
  }
  uVar24 = -(ulong)(0.0 < local_2d8._0_8_);
  uVar18 = CONCAT44(uVar26,uVar25) & uVar24;
  uVar25 = (undefined4)uVar18;
  uVar26 = (undefined4)(uVar18 >> 0x20);
  uVar16 = CONCAT44(uVar28,uVar27) & local_2d8._8_8_;
  auVar29._0_8_ = ~uVar24 & 0x3df0000000000000;
  auVar29._8_8_ = 0;
  auVar5._8_4_ = (int)uVar16;
  auVar5._0_8_ = uVar18;
  auVar5._12_4_ = (int)(uVar16 >> 0x20);
  local_2d8 = auVar29 | auVar5;
  bVar7 = ON_Object::IsKindOf((ON_Object *)this,&ON_RevSurface::m_ON_RevSurface_class_rtti);
  if (bVar7) {
    bVar7 = ON_RevSurface::IsSpherical((ON_RevSurface *)this,sphere,(double)local_2d8._0_8_);
    return bVar7;
  }
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,1);
  local_c8.plane.origin.y = (double)CONCAT44(uVar26,uVar25);
  dVar2 = ON_Interval::Mid((ON_Interval *)&local_c8);
  iVar11 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(SUB84(dVar2,0),this,0)
  ;
  plVar14 = (long *)CONCAT44(extraout_var,iVar11);
  if (plVar14 == (long *)0x0) {
    return false;
  }
  pOVar19 = &ON_Plane::World_xy;
  pOVar20 = &local_c8;
  for (lVar15 = 0x10; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pOVar20->plane).origin.x = (pOVar19->origin).x;
    pOVar19 = (ON_Plane *)((long)pOVar19 + ((ulong)bVar23 * -2 + 1) * 8);
    pOVar20 = (ON_Circle *)((long)pOVar20 + ((ulong)bVar23 * -2 + 1) * 8);
  }
  local_c8.radius = 1.0;
  local_40 = ON_Interval::ZeroToTwoPi.m_t[0];
  dStack_38 = ON_Interval::ZeroToTwoPi.m_t[1];
  uVar12 = local_2d8._0_4_;
  uVar25 = local_2d8._4_4_;
  local_358 = -(uint)(2.3283064365386963e-10 < local_2d8._0_8_) & uVar12;
  cVar8 = (**(code **)(*plVar14 + 0x180))(plVar14,0);
  (**(code **)(*plVar14 + 0x20))(plVar14);
  if (cVar8 != '\0') {
    (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,0);
    local_160.plane.origin.y = (double)CONCAT44(uVar25,uVar12);
    dVar2 = ON_Interval::Mid((ON_Interval *)&local_160);
    iVar11 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])
                       (SUB84(dVar2,0),this,1);
    plVar14 = (long *)CONCAT44(extraout_var_00,iVar11);
    if (plVar14 != (long *)0x0) {
      pOVar19 = &ON_Plane::World_xy;
      pOVar20 = &local_160;
      for (lVar15 = 0x10; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pOVar20->plane).origin.x = (pOVar19->origin).x;
        pOVar19 = (ON_Plane *)((long)pOVar19 + ((ulong)bVar23 * -2 + 1) * 8);
        pOVar20 = (ON_Circle *)((long)pOVar20 + ((ulong)bVar23 * -2 + 1) * 8);
      }
      local_160.radius = 1.0;
      local_d8 = ON_Interval::ZeroToTwoPi.m_t[0];
      dStack_d0 = ON_Interval::ZeroToTwoPi.m_t[1];
      local_2a0 = this;
      local_290 = sphere;
      cVar8 = (**(code **)(*plVar14 + 0x180))(local_358,plVar14,0);
      (**(code **)(*plVar14 + 0x20))(plVar14);
      if (cVar8 == '\0') {
        bVar7 = false;
      }
      else {
        ON_Sphere::ON_Sphere(&local_1e8);
        pOVar20 = &local_c8;
        pOVar21 = &local_1e8;
        for (lVar15 = 0x10; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pOVar21->plane).origin.x = (pOVar20->plane).origin.x;
          pOVar20 = (ON_Circle *)((long)pOVar20 + ((ulong)bVar23 * -2 + 1) * 8);
          pOVar21 = (ON_Sphere *)((long)pOVar21 + (ulong)bVar23 * -0x10 + 8);
        }
        local_1e8.radius = local_c8.radius;
        bVar9 = ON_Sphere::IsValid(&local_1e8);
        ON_Sphere::ON_Sphere(&local_270);
        pOVar20 = &local_160;
        pOVar21 = &local_270;
        for (lVar15 = 0x10; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pOVar21->plane).origin.x = (pOVar20->plane).origin.x;
          pOVar20 = (ON_Circle *)((long)pOVar20 + ((ulong)bVar23 * -2 + 1) * 8);
          pOVar21 = (ON_Sphere *)((long)pOVar21 + (ulong)bVar23 * -0x10 + 8);
        }
        local_270.radius = local_160.radius;
        bVar10 = ON_Sphere::IsValid(&local_270);
        if (bVar9 || bVar10) {
          dVar2 = (local_c8.radius + local_160.radius) * 7.450580596925e-09;
          dVar3 = 0.0;
          local_348 = 0.0;
          local_340 = 0.0;
          do {
            local_2b0 = (dVar3 + dVar3) * 3.141592653589793;
            local_2b8 = dVar3;
            ON_Circle::PointAt(&local_330,&local_c8,local_2b0);
            local_318.z = local_330.z;
            local_318.x = local_330.x;
            local_318.y = local_330.y;
            if (bVar9 != false) {
              point.y = local_330.y;
              point.x = local_330.x;
              point.z = local_330.z;
              ON_Sphere::ClosestPointTo(&local_330,&local_1e8,point);
              local_2f8.z = local_330.z;
              local_2f8.x = local_330.x;
              local_2f8.y = local_330.y;
              dVar3 = ON_3dPoint::DistanceTo(&local_2f8,&local_318);
              if (dVar3 <= dVar2) {
                if (local_340 < dVar3) {
                  local_340 = dVar3;
                }
              }
              else {
                bVar9 = false;
                bVar7 = false;
                if (bVar10 == false) goto LAB_005abc75;
              }
            }
            if (bVar10 != false) {
              point_00.y = local_318.y;
              point_00.x = local_318.x;
              point_00.z = local_318.z;
              ON_Sphere::ClosestPointTo(&local_330,&local_270,point_00);
              local_2f8.z = local_330.z;
              local_2f8.x = local_330.x;
              local_2f8.y = local_330.y;
              dVar3 = ON_3dPoint::DistanceTo(&local_2f8,&local_318);
              if (dVar3 <= dVar2) {
                if (local_348 < dVar3) {
                  local_348 = dVar3;
                }
              }
              else {
                bVar10 = false;
                bVar7 = false;
                if (bVar9 == false) goto LAB_005abc75;
              }
            }
            ON_Circle::PointAt(&local_330,&local_160,local_2b0);
            local_318.z = local_330.z;
            local_318.x = local_330.x;
            local_318.y = local_330.y;
            if (bVar9 != false) {
              point_01.y = local_330.y;
              point_01.x = local_330.x;
              point_01.z = local_330.z;
              ON_Sphere::ClosestPointTo(&local_330,&local_1e8,point_01);
              local_2f8.z = local_330.z;
              local_2f8.x = local_330.x;
              local_2f8.y = local_330.y;
              dVar3 = ON_3dPoint::DistanceTo(&local_2f8,&local_318);
              if (dVar3 <= dVar2) {
                if (local_340 < dVar3) {
                  local_340 = dVar3;
                }
              }
              else {
                bVar9 = false;
                bVar7 = false;
                if (bVar10 == false) goto LAB_005abc75;
              }
            }
            if (bVar10 != false) {
              point_02.y = local_318.y;
              point_02.x = local_318.x;
              point_02.z = local_318.z;
              ON_Sphere::ClosestPointTo(&local_330,&local_270,point_02);
              local_2f8.z = local_330.z;
              local_2f8.x = local_330.x;
              local_2f8.y = local_330.y;
              dVar3 = ON_3dPoint::DistanceTo(&local_2f8,&local_318);
              if (dVar3 <= dVar2) {
                if (local_348 < dVar3) {
                  local_348 = dVar3;
                }
              }
              else {
                bVar10 = false;
                bVar7 = false;
                if (bVar9 == false) goto LAB_005abc75;
              }
            }
            pOVar6 = local_2a0;
            dVar3 = local_2b8 + 0.25;
          } while (dVar3 < 1.0);
          if ((bVar9 == false) && (bVar10 == false)) goto LAB_005abc73;
          uVar12 = (*(local_2a0->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])
                             (local_2a0,0);
          uVar13 = (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(pOVar6,1);
          memblock = onmalloc((long)(int)(uVar12 + uVar13 + 2) << 3);
          local_2a8 = (ulong)uVar13;
          (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(pOVar6,0,memblock);
          lVar15 = (long)(int)uVar12 * 8 + 8 + (long)memblock;
          (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(pOVar6,1,lVar15);
          bVar7 = 0 < (int)uVar12;
          if (0 < (int)uVar12) {
            dVar3 = local_2d8._0_8_;
            if (local_2d8._0_8_ <= dVar2) {
              dVar3 = dVar2;
            }
            local_2d8._8_4_ = local_2d8._8_4_;
            local_2d8._0_8_ = dVar3;
            local_300 = (uint)(local_2a8 >> 0x1f) & 1;
            local_2b8 = (double)(long)(int)local_2a8;
            local_278 = (ulong)((int)local_2a8 + 1);
            local_298 = (ulong)uVar12;
            uVar18 = 0;
            local_2c0 = memblock;
            do {
              uVar16 = (ulong)(uVar18 != 0);
              local_2fc = 0;
              local_288 = uVar18;
              do {
                dVar2 = *(double *)((long)local_2c0 + local_288 * 8 + 8);
                dVar3 = *(double *)((long)local_2c0 + local_288 * 8);
                local_280 = uVar16;
                if ((int)local_2a8 < 0) {
                  uVar18 = (ulong)local_300;
                }
                else {
                  uVar18 = (ulong)local_300;
                  uVar24 = 0;
                  do {
                    local_2b0 = (double)CONCAT71(local_2b0._1_7_,(char)uVar18);
                    uVar12 = (uint)(uVar24 != 0);
                    iVar11 = 4 - (uint)(uVar24 != 0);
                    bVar22 = false;
                    do {
                      PointAt(&local_330,local_2a0,
                              ((double)(4 - (int)uVar16) * dVar3 + (double)(int)uVar16 * dVar2) *
                              0.25,((double)iVar11 * *(double *)(lVar15 + uVar24 * 8) +
                                   (double)(int)uVar12 * *(double *)(lVar15 + 8 + uVar24 * 8)) *
                                   0.25);
                      local_318.z = local_330.z;
                      local_318.x = local_330.x;
                      local_318.y = local_330.y;
                      if (bVar9 != false) {
                        point_03.y = local_330.y;
                        point_03.x = local_330.x;
                        point_03.z = local_330.z;
                        ON_Sphere::ClosestPointTo(&local_330,&local_1e8,point_03);
                        local_2f8.z = local_330.z;
                        local_2f8.x = local_330.x;
                        local_2f8.y = local_330.y;
                        dVar4 = ON_3dPoint::DistanceTo(&local_2f8,&local_318);
                        if (dVar4 <= (double)local_2d8._0_8_) {
                          if (local_340 < dVar4) {
                            local_340 = dVar4;
                          }
                        }
                        else {
                          if (bVar10 == false) {
                            onfree(local_2c0);
                            bVar9 = false;
                            break;
                          }
                          bVar9 = false;
                        }
                      }
                      if (bVar10 != false) {
                        point_04.y = local_318.y;
                        point_04.x = local_318.x;
                        point_04.z = local_318.z;
                        ON_Sphere::ClosestPointTo(&local_330,&local_270,point_04);
                        local_2f8.z = local_330.z;
                        local_2f8.x = local_330.x;
                        local_2f8.y = local_330.y;
                        dVar4 = ON_3dPoint::DistanceTo(&local_2f8,&local_318);
                        if (dVar4 <= (double)local_2d8._0_8_) {
                          if (local_348 < dVar4) {
                            local_348 = dVar4;
                          }
                        }
                        else {
                          if (bVar9 == false) {
                            onfree(local_2c0);
                            bVar10 = false;
                            break;
                          }
                          bVar10 = false;
                        }
                      }
                      bVar22 = 3 < uVar12;
                      uVar12 = uVar12 + 1;
                      iVar11 = iVar11 + -1;
                    } while (uVar12 != 5);
                    uVar17 = (undefined7)(uVar18 >> 8);
                    if (!bVar22) {
                      uVar18 = CONCAT71(uVar17,local_2b0._0_1_);
                      break;
                    }
                    uVar1 = uVar24 + 1;
                    uVar18 = CONCAT71(uVar17,(long)local_2b8 <= (long)uVar24);
                    uVar24 = uVar1;
                  } while (uVar1 != local_278);
                }
                if ((uVar18 & 1) == 0) break;
                uVar12 = (uint)local_280 + 1;
                local_2fc = (uint)CONCAT71((int7)(uVar18 >> 8),3 < (uint)local_280);
                uVar16 = (ulong)uVar12;
              } while (uVar12 != 5);
              memblock = local_2c0;
              if ((local_2fc & 1) == 0) break;
              uVar18 = local_288 + 1;
              bVar7 = uVar18 < local_298;
            } while (uVar18 != local_298);
          }
          if (bVar7) goto LAB_005abc73;
          onfree(memblock);
          bVar7 = (bool)(bVar9 | bVar10);
          if ((local_290 != (ON_Sphere *)0x0) && (bVar9 != false || bVar10 != false)) {
            pOVar21 = &local_1e8;
            if (local_348 < local_340) {
              pOVar21 = &local_270;
            }
            if (bVar10 == false) {
              pOVar21 = &local_1e8;
            }
            if (bVar9 == false) {
              pOVar21 = &local_270;
            }
            memcpy(local_290,pOVar21,0x88);
            bVar7 = true;
          }
        }
        else {
LAB_005abc73:
          bVar7 = false;
        }
LAB_005abc75:
        ON_Sphere::~ON_Sphere(&local_270);
        ON_Sphere::~ON_Sphere(&local_1e8);
      }
      ON_Plane::~ON_Plane(&local_160.plane);
      goto LAB_005abc9c;
    }
  }
  bVar7 = false;
LAB_005abc9c:
  ON_Plane::~ON_Plane(&local_c8.plane);
  return bVar7;
}

Assistant:

bool ON_Surface::IsSphere( ON_Sphere* sphere, double tolerance ) const
{
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;
  const ON_RevSurface* rs = ON_RevSurface::Cast(this);
  if (rs)
  {
    return rs->IsSpherical(sphere,tolerance) ? true : false;
  }

  ON_Curve* crv = IsoCurve(0,Domain(1).Mid());
  if ( !crv )
    return false;

  ON_Arc arc0;
  int bIsArc0 = crv->IsArc(0,&arc0,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  delete crv;
  crv = 0;
  if ( !bIsArc0 )
    return false;

  crv = IsoCurve(1,Domain(0).Mid());
  if ( !crv )
    return false;
  ON_Arc arc1;
  int bIsArc1 = crv->IsArc(0,&arc1,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  delete crv;
  crv = 0;
  if ( !bIsArc1 )
    return false;

  // Determine if one of these arcs is a a portion of a 
  // great circle.

  ON_Sphere sph0;
  sph0.plane = arc0.plane;
  sph0.radius = arc0.radius;
  bool bTestSphere0 = sph0.IsValid();

  ON_Sphere sph1;
  sph1.plane = arc1.plane;
  sph1.radius = arc1.radius;
  bool bTestSphere1 = sph1.IsValid();

  if ( !bTestSphere0 && !bTestSphere1 )
    return false;

  double sph0tol = 0.0;
  double sph1tol = 0.0;

  double tol = 0.5*ON_SQRT_EPSILON*(arc0.radius+arc1.radius);

  ON_3dPoint P, S;
  double a, d;
  for ( a = 0.0; a < 1.0; a += 0.25 )
  {
    P = arc0.PointAt(a*2.0*ON_PI);
    if ( bTestSphere0 )
    {
      S = sph0.ClosestPointTo(P);
      d = S.DistanceTo(P);
      if ( d > tol )
      {
        bTestSphere0 = false;
        if ( !bTestSphere1 )
          return false;
      }
      else if ( d > sph0tol )
        sph0tol = d;
    }
    if ( bTestSphere1 )
    {
      S = sph1.ClosestPointTo(P);
      d = S.DistanceTo(P);
      if ( d > tol )
      {
        bTestSphere1 = false;
        if ( !bTestSphere0 )
          return false;
      }
      else if ( d > sph1tol )
        sph1tol = d;
    }

    P = arc1.PointAt(a*2.0*ON_PI);
    if ( bTestSphere0 )
    {
      S = sph0.ClosestPointTo(P);
      d = S.DistanceTo(P);
      if ( d > tol )
      {
        bTestSphere0 = false;
        if ( !bTestSphere1 )
          return false;
      }
      else if ( d > sph0tol )
        sph0tol = d;
    }
    if ( bTestSphere1 )
    {
      S = sph1.ClosestPointTo(P);
      d = S.DistanceTo(P);
      if ( d > tol )
      {
        bTestSphere1 = false;
        if ( !bTestSphere0 )
          return false;
      }
      else if ( d > sph1tol )
        sph1tol = d;
    }
  }
  // If the arc's are both great circles, then
  // both will be true unless we have a bug or
  // numerical issues.
  if (!bTestSphere0 && !bTestSphere1)
    return false;

  if ( tol < tolerance )
    tol = tolerance;

  double u, v;
  int sc0 = SpanCount(0);
  int sc1 = SpanCount(1);
  double* s = (double*)onmalloc( (sc0+sc1+2)*sizeof(s[0]) );
  double* t = s + (sc0+1);
  GetSpanVector(0,s);
  GetSpanVector(1,t);
  for ( int i = 0; i < sc0; i++ )
  {
    for ( int ii = i?1:0; ii <= 4; ii++ )
    {
      u = 0.25*((4-ii)*s[i] + ii*s[i+1]);
      for ( int j = 0; j <= sc1; j++ )
      {
        for ( int jj = j?1:0; jj <= 4; jj++ )
        {
          v = 0.25*((4-jj)*t[j] + jj*t[j+1]);
          P = PointAt(u,v);
          if ( bTestSphere0 )
          {
            S = sph0.ClosestPointTo(P);
            d = S.DistanceTo(P);
            if ( d > tol )
            {
              bTestSphere0 = false;
              if ( !bTestSphere1 )
              {
                onfree(s);
                return false;
              }
            }
            else if ( d > sph0tol )
              sph0tol = d;
          }
          if ( bTestSphere1 )
          {
            S = sph1.ClosestPointTo(P);
            d = S.DistanceTo(P);
            if ( d > tol )
            {
              bTestSphere1 = false;
              if ( !bTestSphere0 )
              {
                onfree(s);
                return false;
              }
            }
            else if ( d > sph1tol )
              sph1tol = d;
          }
        }
      }
    }
  }
  onfree(s);

  bool rc = (bTestSphere0 || bTestSphere1);
  if ( rc && sphere )
  {
    if (!bTestSphere0)
      *sphere = sph1;
    else if (!bTestSphere1)
      *sphere = sph0;
    else if (sph0tol <= sph1tol)
      *sphere = sph0;
    else
      *sphere = sph1;
  }

  return rc;
}